

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O1

void compact_array_suite::test_uint8(void)

{
  array<unsigned_char,_4UL> value;
  value_type input [6];
  iarchive in;
  array<unsigned_char,_4UL> local_b8;
  undefined4 local_b4;
  uchar local_b0 [8];
  iarchive local_a8;
  
  local_b0[4] = '\x03';
  local_b0[5] = '\x04';
  local_b0[0] = 0xa8;
  local_b0[1] = '\x04';
  local_b0[2] = '\x01';
  local_b0[3] = '\x02';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[6]>(&local_a8,(uchar (*) [6])local_b0)
  ;
  local_b8._M_elems[0] = 0xff;
  local_b8._M_elems[1] = 0xff;
  local_b8._M_elems[2] = 0xff;
  local_b8._M_elems[3] = 0xff;
  trial::protocol::serialization::
  load_overloader<trial::protocol::bintoken::iarchive,_std::array<unsigned_char,_4UL>,_void>::load
            (&local_a8,&local_b8,0);
  local_b4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[0]","UINT8_C(0x01)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x66,"void compact_array_suite::test_uint8()",&local_b8,&local_b4);
  local_b4 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[1]","UINT8_C(0x02)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x67,"void compact_array_suite::test_uint8()",local_b8._M_elems + 1,&local_b4);
  local_b4 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[2]","UINT8_C(0x03)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x68,"void compact_array_suite::test_uint8()",local_b8._M_elems + 2,&local_b4);
  local_b4 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[3]","UINT8_C(0x04)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x69,"void compact_array_suite::test_uint8()",local_b8._M_elems + 3,&local_b4);
  local_a8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_001297c8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_a8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_a8);
  return;
}

Assistant:

void test_uint8()
{
    const value_type input[] = { token::code::array8_int8, 4 * token::int8::size,
                                 0x01,
                                 0x02,
                                 0x03,
                                 0x04 };
    format::iarchive in(input);
    std::array<std::uint8_t, 4> value = {{ std::numeric_limits<std::uint8_t>::max(),
                                           std::numeric_limits<std::uint8_t>::max(),
                                           std::numeric_limits<std::uint8_t>::max(),
                                           std::numeric_limits<std::uint8_t>::max() }};
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], UINT8_C(0x01));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], UINT8_C(0x02));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], UINT8_C(0x03));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], UINT8_C(0x04));
}